

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O3

chunk_conflict * moria_gen(player *p,wchar_t min_height,wchar_t min_width,char **p_error)

{
  _Bool quest;
  ushort uVar1;
  short sVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  room_profile profile;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined1 uVar12;
  undefined3 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  _Bool _Var16;
  int16_t iVar17;
  uint32_t uVar18;
  uint uVar19;
  wchar_t wVar20;
  uint32_t uVar21;
  chunk *c;
  _Bool **pp_Var22;
  _Bool *p_Var23;
  room_profile *prVar24;
  char *pcVar25;
  cave_profile *pcVar26;
  dun_data *pdVar27;
  int iVar28;
  wchar_t wVar29;
  long lVar30;
  ulong uVar31;
  wchar_t wVar32;
  int local_4c;
  
  uVar18 = Rand_div(10);
  iVar28 = 0x5f;
  if (dun->quest == false) {
    uVar19 = uVar18 + (int)p->depth / 0x18 + 1;
    iVar28 = 0x46;
    if ((1 < (int)uVar19) && (iVar28 = 0x4b, uVar19 != 2)) {
      iVar28 = 0x50;
      if ((3 < uVar19) && (iVar28 = 0x55, uVar19 != 4)) {
        iVar28 = (uint)(5 < uVar19) * 5 + 0x5a;
      }
    }
  }
  uVar1 = z_info->dungeon_hgt;
  uVar18 = Rand_div(10);
  wVar20 = (int)((uVar18 + iVar28) * (uint)uVar1) / 100;
  uVar1 = z_info->dungeon_wid;
  uVar18 = Rand_div(10);
  pdVar27 = dun;
  wVar32 = (int)((uVar18 + iVar28) * (uint)uVar1) / 100;
  if (wVar20 <= min_height) {
    wVar20 = min_height;
  }
  if ((int)(uint)z_info->dungeon_hgt <= wVar20) {
    wVar20 = (uint)z_info->dungeon_hgt;
  }
  if (wVar32 <= min_width) {
    wVar32 = min_width;
  }
  if ((int)(uint)z_info->dungeon_wid <= wVar32) {
    wVar32 = (uint)z_info->dungeon_wid;
  }
  pcVar26 = dun->profile;
  wVar3 = pcVar26->block_size;
  dun->block_hgt = wVar3;
  pdVar27->block_wid = wVar3;
  sVar2 = p->depth;
  _Var16 = pdVar27->persist;
  wVar3 = pcVar26->dun_unusual;
  wVar4 = pcVar26->n_room_profiles;
  c = (chunk *)cave_new(wVar20,wVar32);
  c->depth = (int)sVar2;
  wVar20 = c->height;
  wVar32 = c->width;
  uVar19 = (wVar32 * wVar20) / 7;
  if ((player->opts).opt[0x18] == true) {
    msg("height=%d  width=%d  nfloors=%d",(ulong)(uint)wVar20,(ulong)(uint)wVar32,(ulong)uVar19);
    wVar20 = c->height;
    wVar32 = c->width;
  }
  fill_rectangle(c,L'\0',L'\0',wVar20 + L'\xffffffff',wVar32 + L'\xffffffff',L'\x15',L'\0');
  draw_rectangle(c,L'\0',L'\0',c->height + L'\xffffffff',c->width + L'\xffffffff',L'\x16',L'\0',true
                );
  pdVar27 = dun;
  wVar20 = c->height / dun->block_hgt;
  dun->row_blocks = wVar20;
  pdVar27->col_blocks = c->width / pdVar27->block_wid;
  pp_Var22 = (_Bool **)mem_zalloc((long)wVar20 << 3);
  pdVar27 = dun;
  dun->room_map = pp_Var22;
  if (L'\0' < pdVar27->row_blocks) {
    lVar30 = 0;
    do {
      p_Var23 = (_Bool *)mem_zalloc((long)pdVar27->col_blocks);
      dun->room_map[lVar30] = p_Var23;
      lVar30 = lVar30 + 1;
      pdVar27 = dun;
    } while (lVar30 < dun->row_blocks);
  }
  pdVar27->pit_num = L'\0';
  pdVar27->cent_n = L'\0';
  reset_entrance_data((chunk_conflict *)c);
  if (_Var16 != false) {
    build_staircase_rooms((chunk_conflict *)c,"Moria Generation");
  }
  local_4c = 0;
LAB_0014a60b:
  do {
    if (((int)uVar19 <= c->feat_count[1]) && (L'\x01' < dun->cent_n)) {
      if (L'\0' < dun->row_blocks) {
        lVar30 = 0;
        do {
          mem_free(dun->room_map[lVar30]);
          lVar30 = lVar30 + 1;
        } while (lVar30 < dun->row_blocks);
      }
      mem_free(dun->room_map);
      do_traditional_tunneling((chunk_conflict *)c);
      ensure_connectedness((chunk_conflict *)c,true);
      wVar20 = L'\0';
      draw_rectangle(c,L'\0',L'\0',c->height + L'\xffffffff',c->width + L'\xffffffff',L'\x15',L'\0',
                     true);
      draw_rectangle(c,L'\0',L'\0',c->height + L'\xffffffff',c->width + L'\xffffffff',L'\x16',L'\0',
                     true);
      pcVar26 = dun->profile;
      if (L'\0' < (pcVar26->str).mag) {
        do {
          build_streamer((chunk_conflict *)c,L'\x11',(pcVar26->str).mc);
          wVar20 = wVar20 + L'\x01';
          pcVar26 = dun->profile;
        } while (wVar20 < (pcVar26->str).mag);
      }
      if (L'\0' < (pcVar26->str).qua) {
        wVar20 = L'\0';
        do {
          build_streamer((chunk_conflict *)c,L'\x12',(pcVar26->str).qc);
          wVar20 = wVar20 + L'\x01';
          pcVar26 = dun->profile;
        } while (wVar20 < (pcVar26->str).qua);
      }
      _Var16 = dun->persist;
      quest = dun->quest;
      wVar20 = rand_range(3,4);
      wVar32 = rand_range(1,2);
      handle_level_stairs((chunk_conflict *)c,_Var16,quest,wVar20,wVar32);
      wVar20 = c->depth;
      uVar18 = (uint)(L'\x05' < wVar20) * 8 + 2;
      if (0xffffffe4 < (uint)(wVar20 + L'\xffffffdf')) {
        uVar18 = wVar20 / 3;
      }
      uVar21 = Rand_div(uVar18);
      alloc_objects((chunk_conflict *)c,L'\x01',L'\0',uVar21 + L'\x01',c->depth,'\0');
      uVar21 = Rand_div(uVar18);
      alloc_objects((chunk_conflict *)c,L'\x01',L'\x01',(int)(uVar21 + 1) / 5,c->depth,'\0');
      _Var16 = new_player_spot((chunk_conflict *)c,p);
      if (_Var16) {
        uVar1 = z_info->level_monster_min;
        uVar21 = Rand_div(8);
        mon_restrict("Moria dwellers",c->depth,c->depth,true);
        if (0 < (int)((uint)uVar1 + uVar18 + uVar21 + 1)) {
          uVar19 = (uint)uVar1 + uVar18 + uVar21 + 2;
          do {
            pick_and_place_distant_monster(c,p->grid,L'\0',true,c->depth);
            uVar19 = uVar19 - 1;
          } while (1 < uVar19);
        }
        mon_restrict((char *)0x0,c->depth,c->depth,false);
        iVar17 = Rand_normal((uint)z_info->room_item_av,3);
        alloc_objects((chunk_conflict *)c,L'\x02',L'\x03',(int)iVar17,c->depth,'\x01');
        iVar17 = Rand_normal((uint)z_info->both_item_av,3);
        alloc_objects((chunk_conflict *)c,L'\x03',L'\x03',(int)iVar17,c->depth,'\x01');
        iVar17 = Rand_normal((uint)z_info->both_gold_av,3);
        alloc_objects((chunk_conflict *)c,L'\x03',L'\x02',(int)iVar17,c->depth,'\x01');
        return (chunk_conflict *)c;
      }
      uncreate_artifacts((chunk_conflict *)c);
      wipe_mon_list(c,p);
      cave_free((chunk_conflict *)c);
      pcVar25 = "could not place player";
      goto LAB_0014aa2e;
    }
    if (local_4c == 0x1f5) {
      uncreate_artifacts((chunk_conflict *)c);
      wipe_mon_list(c,p);
      cave_free((chunk_conflict *)c);
      pcVar25 = "moria chunk could not be created";
LAB_0014aa2e:
      *p_error = pcVar25;
      return (chunk_conflict *)0x0;
    }
    local_4c = local_4c + 1;
    wVar20 = Rand_div(100);
    wVar32 = L'\0';
    do {
      if (dun->profile->max_rarity <= wVar32) goto LAB_0014a683;
      uVar18 = Rand_div(wVar3);
      iVar28 = c->depth / 2 + 0x32;
      wVar32 = wVar32 + L'\x01';
    } while ((int)uVar18 < iVar28);
    wVar32 = wVar32 + (uint)((int)uVar18 < iVar28) + L'\xffffffff';
LAB_0014a683:
    if (L'\0' < wVar4) {
      uVar31 = 0;
      do {
        prVar24 = dun->profile->room_profiles + uVar31;
        while ((wVar32 < prVar24->rarity || (prVar24->cutoff <= wVar20))) {
          wVar29 = (int)uVar31 + L'\x01';
          uVar31 = (ulong)(uint)wVar29;
          prVar24 = prVar24 + 1;
          if (wVar4 <= wVar29) goto LAB_0014a60b;
        }
        uVar5 = prVar24->next;
        uVar6 = prVar24->name;
        uVar7 = prVar24->builder;
        uVar8 = prVar24->rating;
        uVar9 = prVar24->height;
        uVar10 = prVar24->width;
        uVar11 = prVar24->level;
        uVar12 = prVar24->pit;
        uVar13 = *(undefined3 *)&prVar24->field_0x29;
        uVar14 = prVar24->rarity;
        uVar15 = prVar24->cutoff;
        profile.cutoff = uVar15;
        profile.rarity = uVar14;
        profile._41_3_ = uVar13;
        profile.pit = (_Bool)uVar12;
        profile.level = uVar11;
        profile.width = uVar10;
        profile.height = uVar9;
        profile.rating = uVar8;
        profile.builder = (room_builder_conflict)uVar7;
        profile.name = (char *)uVar6;
        profile.next = (room_profile *)uVar5;
        profile._52_4_ = (int)((ulong)*(undefined8 *)&prVar24->cutoff >> 0x20);
        _Var16 = room_build(c,L'\0',L'\0',profile,true);
      } while ((!_Var16) &&
              (wVar29 = (int)uVar31 + L'\x01', uVar31 = (ulong)(uint)wVar29, wVar29 < wVar4));
    }
  } while( true );
}

Assistant:

struct chunk *moria_gen(struct player *p, int min_height, int min_width,
		const char **p_error)
{
	int i, k;
	int size_percent, y_size, x_size;
	struct chunk *c;

	/* Scale the level */
	i = randint1(10) + p->depth / 24;
	if (dun->quest) size_percent = 100;
	else if (i < 2) size_percent = 75;
	else if (i < 3) size_percent = 80;
	else if (i < 4) size_percent = 85;
	else if (i < 5) size_percent = 90;
	else if (i < 6) size_percent = 95;
	else size_percent = 100;
	y_size = z_info->dungeon_hgt * (size_percent - 5 + randint0(10)) / 100;
	x_size = z_info->dungeon_wid * (size_percent - 5 + randint0(10)) / 100;

	/* Enforce dimension limits */
	y_size = MIN(MAX(y_size, min_height), z_info->dungeon_hgt);
	x_size = MIN(MAX(x_size, min_width), z_info->dungeon_wid);

	/* Set the block height and width */
	dun->block_hgt = dun->profile->block_size;
	dun->block_wid = dun->profile->block_size;

	c = moria_chunk(p, p->depth, MIN(z_info->dungeon_hgt, y_size),
		MIN(z_info->dungeon_wid, x_size), dun->persist);
	if (!c) {
		*p_error = "moria chunk could not be created";
		return NULL;
	}

	/* Generate permanent walls around the edge of the generated area */
	draw_rectangle(c, 0, 0, c->height - 1, c->width - 1,
		FEAT_PERM, SQUARE_NONE, true);

	/* Add some magma streamers */
	for (i = 0; i < dun->profile->str.mag; i++)
		build_streamer(c, FEAT_MAGMA, dun->profile->str.mc);

	/* Add some quartz streamers */
	for (i = 0; i < dun->profile->str.qua; i++)
		build_streamer(c, FEAT_QUARTZ, dun->profile->str.qc);

	/* Place 3 or 4 down stairs and 1 or 2 up stairs near some walls */
	handle_level_stairs(c, dun->persist, dun->quest,
		rand_range(3, 4), rand_range(1, 2));

	/* General amount of rubble, traps and monsters */
	k = MAX(MIN(c->depth / 3, 10), 2);

	/* Put some rubble in corridors */
	alloc_objects(c, SET_CORR, TYP_RUBBLE, randint1(k), c->depth, 0);

	/* Place some traps in the dungeon, reduce frequency by factor of 5 */
	alloc_objects(c, SET_CORR, TYP_TRAP, randint1(k)/5, c->depth, 0);

	/* Determine the character location */
	if (!new_player_spot(c, p)) {
		uncreate_artifacts(c);
		wipe_mon_list(c, p);
		cave_free(c);
		*p_error = "could not place player";
		return NULL;
	}

	/* Pick a base number of monsters */
	i = z_info->level_monster_min + randint1(8) + k;

	/* Moria levels have a high proportion of cave dwellers. */
	mon_restrict("Moria dwellers", c->depth, c->depth, true);

	/* Put some monsters in the dungeon */
	for (; i > 0; i--) {
		pick_and_place_distant_monster(c, p->grid, 0, true, c->depth);
	}

	/* Remove our restrictions. */
	(void) mon_restrict(NULL, c->depth, c->depth, false);

	/* Put some objects in rooms */
	alloc_objects(c, SET_ROOM, TYP_OBJECT,
		Rand_normal(z_info->room_item_av, 3), c->depth, ORIGIN_FLOOR);

	/* Put some objects/gold in the dungeon */
	alloc_objects(c, SET_BOTH, TYP_OBJECT,
		Rand_normal(z_info->both_item_av, 3), c->depth, ORIGIN_FLOOR);
	alloc_objects(c, SET_BOTH, TYP_GOLD,
		Rand_normal(z_info->both_gold_av, 3), c->depth, ORIGIN_FLOOR);

	return c;
}